

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

CopyStatus kwssys::SystemTools::CopyFileIfDifferent(string *source,string *destination)

{
  bool bVar1;
  Status s;
  string *in_RSI;
  CopyStatus CVar2;
  string new_destination;
  string *in_stack_000000e8;
  string *in_stack_000000f0;
  string *in_stack_00001028;
  string *in_stack_000024c0;
  string *in_stack_000024c8;
  string *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  string local_40 [16];
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  CopyStatus local_c;
  
  bVar1 = FileIsDirectory(in_stack_00001028);
  if (bVar1) {
    FileInDir(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    bVar1 = ComparePath((string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
    if (!bVar1) {
      local_c = CopyFileIfDifferent(in_RSI,in_stack_ffffffffffffffd8);
    }
    std::__cxx11::string::~string(local_40);
    if (!bVar1) {
      return local_c;
    }
  }
  else {
    bVar1 = FilesDiffer(in_stack_000024c8,in_stack_000024c0);
    if (bVar1) {
      CVar2 = CopyFileAlways(in_stack_000000f0,in_stack_000000e8);
      return CVar2;
    }
  }
  s = Status::Success();
  CopyStatus::CopyStatus(&local_c,s,NoPath);
  return local_c;
}

Assistant:

SystemTools::CopyStatus SystemTools::CopyFileIfDifferent(
  std::string const& source, std::string const& destination)
{
  // special check for a destination that is a directory
  // FilesDiffer does not handle file to directory compare
  if (SystemTools::FileIsDirectory(destination)) {
    const std::string new_destination = FileInDir(source, destination);
    if (!SystemTools::ComparePath(new_destination, destination)) {
      return SystemTools::CopyFileIfDifferent(source, new_destination);
    }
  } else {
    // source and destination are files so do a copy if they
    // are different
    if (SystemTools::FilesDiffer(source, destination)) {
      return SystemTools::CopyFileAlways(source, destination);
    }
  }
  // at this point the files must be the same so return true
  return CopyStatus{ Status::Success(), CopyStatus::NoPath };
}